

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

NULLCRef * nullcGetResultObject(void)

{
  NULLCRef *in_RDI;
  undefined8 local_14;
  NULLCRef empty;
  
  memset(&local_14,0,0xc);
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    *(undefined8 *)in_RDI = local_14;
    *(uint *)((long)&in_RDI->ptr + 4) = empty.typeID;
  }
  else if (NULLC::currExec == 1) {
    ExecutorX86::GetResultObject(in_RDI,NULLC::executorX86);
  }
  else if (NULLC::currExec == 0) {
    ExecutorRegVm::GetResultObject(in_RDI,NULLC::executorRegVm);
  }
  else {
    *(undefined8 *)in_RDI = local_14;
    *(uint *)((long)&in_RDI->ptr + 4) = empty.typeID;
  }
  return in_RDI;
}

Assistant:

NULLCRef nullcGetResultObject()
{
	NULLCRef empty = { 0, 0 };

	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(empty);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetResultObject();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetResultObject();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetResultObject();
#endif

	return empty;
}